

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O0

void key_match(char **strs,int nstr,char **pattern,int exact,int *ikey,int *mkey)

{
  int iVar1;
  char **ppcVar2;
  bool bVar3;
  __compar_fn_t local_58;
  _func_int_void_ptr_void_ptr *fnpt;
  int i;
  char **pi;
  char **p;
  int *mkey_local;
  int *ikey_local;
  int exact_local;
  char **pattern_local;
  int nstr_local;
  char **strs_local;
  
  *mkey = -999;
  *ikey = -99;
  if (exact == 0) {
    local_58 = compstrp;
  }
  else {
    local_58 = compstre;
  }
  ppcVar2 = (char **)bsearch(pattern,strs,(long)nstr,8,local_58);
  if (ppcVar2 != (char **)0x0) {
    *mkey = 1;
    *ikey = (int)((long)ppcVar2 - (long)strs >> 3);
    fnpt._4_4_ = *ikey;
    pi = ppcVar2;
    while( true ) {
      pi = pi + -1;
      fnpt._4_4_ = fnpt._4_4_ + -1;
      bVar3 = false;
      if (0 < fnpt._4_4_) {
        iVar1 = (*local_58)(pattern,pi);
        bVar3 = iVar1 == 0;
      }
      if (!bVar3) break;
      *mkey = *mkey + 1;
      *ikey = fnpt._4_4_;
    }
    fnpt._4_4_ = *ikey + *mkey;
    pi = ppcVar2;
    while( true ) {
      pi = pi + 1;
      bVar3 = false;
      if (fnpt._4_4_ < nstr) {
        iVar1 = (*local_58)(pattern,pi);
        bVar3 = iVar1 == 0;
      }
      if (!bVar3) break;
      *mkey = *mkey + 1;
      fnpt._4_4_ = fnpt._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void key_match(char **strs,  	/* fits keyname  array */
             int nstr,		/* total number of keys */
             char **pattern,	/* wanted pattern  */ 
             int exact,		/* exact matching or pattern matching  
                                   exact = 1: exact matching.
                                   exact = 0: pattern matching. 
                                   Any keywords with "patten"* is included
                                */
                                
             int *ikey,		/* The element number of first key 
                                   Return -99 if not found */ 
             int *mkey		/* total number of key matched 
                                   return -999 if not found */
            )  			
{ 
     char **p;
     char **pi;
     int i;
     int (*fnpt)(const void *, const void *); 
     *mkey = -999;
     *ikey = -99;
     if(exact)  
	 fnpt = compstre;
     else 
         fnpt = compstrp;
     p = (char **)bsearch(pattern, strs, nstr,sizeof(char *), fnpt); 
     if(p) {	    
        *mkey = 1; 
        *ikey = p - strs; 
	pi = p;
	i = *ikey - 1;
	p--;
        while(i > 0 && !fnpt(pattern, p)) {*mkey += 1; *ikey =i; i--; p--;}
	p = pi;
	i = *ikey + *mkey;
        p++;
        while(i < nstr && !fnpt(pattern, p) ) {*mkey += 1; i++; p++;}
     }
     return;
}